

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::InsertSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<Fad<double>_> *pA)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  long local_80;
  Fad<double> local_50;
  
  lVar1 = pRow + rowSize;
  if (lVar1 <= (pA->super_TPZBaseMatrix).fRow) {
    if (pCol + colSize <= (pA->super_TPZBaseMatrix).fCol) {
      if (0 < rowSize) {
        local_80 = sRow;
        do {
          iVar3 = sCol;
          iVar4 = pCol;
          if (0 < colSize) {
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_50,this,local_80,iVar3);
              (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (pA,pRow,iVar4,&local_50);
              Fad<double>::~Fad(&local_50);
              iVar4 = iVar4 + 1;
              iVar3 = iVar3 + 1;
            } while (iVar4 < pCol + colSize);
          }
          pRow = pRow + 1;
          local_80 = local_80 + 1;
        } while (pRow < lVar1);
      }
      return 1;
    }
  }
  iVar2 = Error("InsertSub <the sub-matrix is too big that target>",(char *)0x0);
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::InsertSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							   const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
	
	
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        return( Error( "InsertSub <the sub-matrix is too big that target>" ) );
    }
	
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}